

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cc
# Opt level: O2

void predict_or_learn_multi<true,true>(nn *n,single_learner *base,example *ec)

{
  uchar **ppuVar1;
  polylabel *ppVar2;
  polylabel *ppVar3;
  features *pfVar4;
  float fVar5;
  int iVar6;
  int iVar7;
  shared_data *psVar8;
  _func_void_shared_data_ptr_float *p_Var9;
  loss_function *plVar10;
  bool *pbVar11;
  polyprediction *pred;
  shared_data *psVar12;
  uint64_t uVar13;
  _func_void_int_string_v_array<char> *p_Var14;
  label_t lVar15;
  wclass *pwVar16;
  size_t sVar17;
  v_array<char> vVar18;
  byte bVar19;
  bool bVar20;
  uint i_6;
  uint64_t uVar21;
  ulong uVar22;
  ostream *poVar23;
  v_array<char> *pvVar24;
  long lVar25;
  uint i;
  uint uVar26;
  ulong uVar27;
  polyprediction *ppVar28;
  features *pfVar29;
  features *pfVar30;
  uint i_5;
  vw *pvVar31;
  long lVar32;
  uint i_1;
  byte bVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float extraout_XMM0_Da;
  float fVar37;
  float fVar38;
  example *peVar39;
  example *peVar40;
  example *ec_00;
  undefined4 in_stack_fffffffffffffc50;
  float fVar41;
  polyprediction *ppVar42;
  float local_374;
  float local_370;
  float local_36c;
  string local_310 [32];
  ostringstream outputStringStream;
  shared_data sd;
  features save_nn_output_namespace;
  
  bVar33 = 0;
  pvVar31 = n->all;
  iVar6 = pvVar31->raw_prediction;
  if (n->finished_setup == false) {
    finish_setup(n,pvVar31);
    pvVar31 = n->all;
  }
  memcpy(&sd,pvVar31->sd,0xe0);
  psVar8 = pvVar31->sd;
  pvVar31->sd = &sd;
  if (n->dropout == false) {
    fVar34 = 1.0;
  }
  else {
    fVar34 = 2.0;
  }
  fVar5 = (ec->l).simple.label;
  p_Var9 = n->all->set_minmax;
  plVar10 = n->all->loss;
  pbVar11 = n->dropped_out;
  pred = n->hidden_units_pred;
  ppVar28 = n->hiddenbias_pred;
  peVar39 = ec;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&outputStringStream);
  n->all->set_minmax = noop_mm;
  n->all->loss = n->squared_loss;
  psVar12 = n->all->sd;
  fVar41 = psVar12->min_label;
  psVar12->min_label = -3.0;
  psVar12 = n->all->sd;
  fVar36 = psVar12->max_label;
  psVar12->max_label = 3.0;
  uVar13 = (ec->super_example_predict).ft_offset;
  uVar21 = uVar13;
  if (n->multitask == true) {
    (ec->super_example_predict).ft_offset = 0;
    uVar21 = 0;
  }
  (n->hiddenbias).super_example_predict.ft_offset = uVar21;
  LEARNER::learner<char,_example>::multipredict(base,&n->hiddenbias,0,(ulong)n->k,ppVar28,true);
  ppVar2 = &ec->l;
  ppVar42 = ppVar28;
  for (uVar27 = 0; uVar27 < n->k; uVar27 = uVar27 + 1) {
    if ((ppVar28->scalar == 0.0) && (!NAN(ppVar28->scalar))) {
      fVar35 = merand48(&n->all->random_state);
      (n->hiddenbias).l.simple.label = fVar35 + -0.5;
      LEARNER::learner<char,_example>::learn(base,&n->hiddenbias,uVar27);
      (n->hiddenbias).l.multi.label = 0x7f7fffff;
    }
    ppVar28 = ppVar28 + 1;
  }
  uVar26 = 1;
  LEARNER::learner<char,_example>::multipredict(base,peVar39,0,(ulong)n->k,pred,true);
  for (uVar27 = 0; uVar22 = (ulong)n->k, uVar27 < uVar22; uVar27 = uVar27 + 1) {
    if (n->dropout == true) {
      fVar35 = merand48(&n->xsubi);
      bVar20 = fVar35 < 0.5;
    }
    else {
      bVar20 = false;
    }
    pbVar11[uVar27] = bVar20;
  }
  ec_00 = peVar39;
  if (peVar39->passthrough != (features *)0x0) {
    lVar32 = 0;
    for (uVar27 = 0; uVar27 < uVar22; uVar27 = uVar27 + 1) {
      add_passthrough_feature_magic
                (peVar39,0x398d4541,(ulong)(uVar26 - 1),*(float *)((long)ppVar42 + lVar32));
      add_passthrough_feature_magic
                (peVar39,0x398d4541,(ulong)uVar26,*(float *)((long)pred + lVar32));
      uVar22 = (ulong)n->k;
      uVar26 = uVar26 + 2;
      lVar32 = lVar32 + 0x20;
    }
  }
  if (0 < iVar6) {
    ppVar28 = pred;
    for (uVar27 = 0; uVar27 < uVar22; uVar27 = uVar27 + 1) {
      if (uVar27 != 0) {
        std::operator<<((ostream *)&outputStringStream,' ');
      }
      poVar23 = std::ostream::_M_insert<unsigned_long>((ulong)&outputStringStream);
      poVar23 = std::operator<<(poVar23,':');
      poVar23 = (ostream *)std::ostream::operator<<(poVar23,ppVar28->scalar);
      poVar23 = std::operator<<(poVar23,',');
      fVar35 = fasttanh(ppVar28->scalar);
      std::ostream::operator<<(poVar23,fVar35);
      uVar22 = (ulong)n->k;
      ppVar28 = ppVar28 + 1;
    }
  }
  n->all->loss = plVar10;
  n->all->set_minmax = p_Var9;
  n->all->sd->min_label = fVar41;
  n->all->sd->max_label = fVar36;
  (ec_00->super_example_predict).ft_offset = uVar13;
  peVar39 = &n->outputweight;
  ppVar3 = &(n->output_layer).l;
  pfVar4 = (ec_00->super_example_predict).feature_space + 0x81;
  pvVar24 = &ec_00->tag;
  bVar19 = 1;
  local_370 = 0.0;
  local_36c = 0.0;
  local_374 = 0.0;
  while( true ) {
    (n->output_layer).total_sum_feat_sq = 1.0;
    (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq = 1.0;
    (n->outputweight).super_example_predict.ft_offset = (ec_00->super_example_predict).ft_offset;
    n->all->set_minmax = noop_mm;
    n->all->loss = n->squared_loss;
    psVar12 = n->all->sd;
    fVar41 = psVar12->min_label;
    psVar12->min_label = -1.0;
    psVar12 = n->all->sd;
    fVar36 = psVar12->max_label;
    psVar12->max_label = 1.0;
    ppVar28 = pred;
    for (uVar27 = 0; uVar27 < n->k; uVar27 = uVar27 + 1) {
      fVar35 = 0.0;
      if (pbVar11[uVar27] == false) {
        fVar35 = fasttanh(ppVar28->scalar);
        fVar35 = fVar35 * fVar34;
      }
      (n->output_layer).super_example_predict.feature_space[0x81].values._begin[uVar27] = fVar35;
      (n->output_layer).total_sum_feat_sq = (n->output_layer).total_sum_feat_sq + fVar35 * fVar35;
      (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq =
           fVar35 * fVar35 + (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq
      ;
      *(n->outputweight).super_example_predict.feature_space[0x81].indicies._begin =
           (n->output_layer).super_example_predict.feature_space[0x81].indicies._begin[uVar27];
      LEARNER::learner<char,_example>::predict(base,peVar39,(ulong)n->k);
      fVar35 = (n->outputweight).pred.scalar;
      if ((fVar35 == 0.0) && (!NAN(fVar35))) {
        uVar26 = n->k;
        fVar35 = merand48(&n->all->random_state);
        (n->outputweight).l.simple.label = (fVar35 + -0.5) / SQRT((float)uVar26);
        LEARNER::learner<char,_example>::update(base,peVar39,(ulong)n->k);
        (n->outputweight).l.multi.label = 0x7f7fffff;
      }
      ppVar28 = ppVar28 + 1;
    }
    n->all->loss = plVar10;
    n->all->set_minmax = p_Var9;
    n->all->sd->min_label = fVar41;
    n->all->sd->max_label = fVar36;
    if (n->inpass == false) {
      (n->output_layer).super_example_predict.ft_offset = (ec_00->super_example_predict).ft_offset;
      (n->output_layer).l.cb_eval.event.costs.erase_count = (ec->l).cb_eval.event.costs.erase_count;
      lVar15 = ppVar2->multi;
      pwVar16 = (ec->l).cs.costs._end;
      sVar17 = (ec->l).cs.costs.erase_count;
      (n->output_layer).l.cs.costs.end_array = (ec->l).cs.costs.end_array;
      (n->output_layer).l.cs.costs.erase_count = sVar17;
      ppVar3->multi = lVar15;
      (n->output_layer).l.cs.costs._end = pwVar16;
      (n->output_layer).weight = ec_00->weight;
      (n->output_layer).partial_prediction = 0.0;
      LEARNER::learner<char,_example>::learn(base,&n->output_layer,(ulong)n->k);
      (ec->l).cb_eval.event.costs.erase_count = (n->output_layer).l.cb_eval.event.costs.erase_count;
      lVar15 = ppVar3->multi;
      pwVar16 = (n->output_layer).l.cs.costs._end;
      sVar17 = (n->output_layer).l.cs.costs.erase_count;
      (ec->l).cs.costs.end_array = (n->output_layer).l.cs.costs.end_array;
      (ec->l).cs.costs.erase_count = sVar17;
      ppVar2->multi = lVar15;
      (ec->l).cs.costs._end = pwVar16;
    }
    else {
      v_array<unsigned_char>::push_back((v_array<unsigned_char> *)ec_00,&nn_output_namespace);
      pfVar29 = pfVar4;
      pfVar30 = &save_nn_output_namespace;
      for (lVar32 = 0xd; lVar32 != 0; lVar32 = lVar32 + -1) {
        (pfVar30->values)._begin = (pfVar29->values)._begin;
        pfVar29 = (features *)((long)pfVar29 + (ulong)bVar33 * -0x10 + 8);
        pfVar30 = (features *)((long)pfVar30 + (ulong)bVar33 * -0x10 + 8);
      }
      lVar32 = 100;
      pfVar29 = (n->output_layer).super_example_predict.feature_space + 0x81;
      pfVar30 = pfVar4;
      for (lVar25 = lVar32; lVar25 != 0; lVar25 = lVar25 + -1) {
        *(undefined1 *)&(pfVar30->values)._begin = *(undefined1 *)&(pfVar29->values)._begin;
        pfVar29 = (features *)((long)pfVar29 + (ulong)bVar33 * -2 + 1);
        pfVar30 = (features *)((long)pfVar30 + (ulong)bVar33 * -2 + 1);
      }
      ec_00->total_sum_feat_sq =
           (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq +
           ec_00->total_sum_feat_sq;
      peVar40 = ec_00;
      LEARNER::learner<char,_example>::learn(base,ec_00,(ulong)n->k);
      (n->output_layer).partial_prediction = ec_00->partial_prediction;
      (n->output_layer).loss = ec_00->loss;
      ec_00->total_sum_feat_sq =
           ec_00->total_sum_feat_sq -
           (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq;
      pfVar29 = &save_nn_output_namespace;
      pfVar30 = pfVar4;
      for (; lVar32 != 0; lVar32 = lVar32 + -1) {
        *(undefined1 *)&(pfVar30->values)._begin = *(undefined1 *)&(pfVar29->values)._begin;
        pfVar29 = (features *)((long)pfVar29 + (ulong)bVar33 * -2 + 1);
        pfVar30 = (features *)((long)pfVar30 + (ulong)bVar33 * -2 + 1);
      }
      ppuVar1 = &(ec_00->super_example_predict).indices._end;
      *ppuVar1 = *ppuVar1 + -1;
      ec_00 = peVar40;
    }
    fVar36 = GD::finalize_prediction(n->all->sd,(n->output_layer).partial_prediction);
    n->prediction = fVar36;
    if (0 < iVar6) {
      poVar23 = std::operator<<((ostream *)&outputStringStream,' ');
      std::ostream::operator<<(poVar23,(n->output_layer).partial_prediction);
      p_Var14 = n->all->print_text;
      iVar7 = n->all->raw_prediction;
      std::__cxx11::stringbuf::str();
      vVar18._end._0_4_ = in_stack_fffffffffffffc50;
      vVar18._begin = (char *)ec_00;
      vVar18._end._4_4_ = fVar41;
      vVar18.end_array = (char *)base;
      vVar18.erase_count = (size_t)peVar39;
      (*p_Var14)(iVar7,(string)*pvVar24,vVar18);
      std::__cxx11::string::~string(local_310);
    }
    pvVar31 = n->all;
    if ((pvVar31->training == true) && ((fVar5 != 3.4028235e+38 || (NAN(fVar5))))) {
      (*pvVar31->loss->_vptr_loss_function[6])(n->prediction,fVar5,pvVar31->loss,pvVar31->sd);
      if (extraout_XMM0_Da != 0.0) {
        n->all->loss = n->squared_loss;
        n->all->set_minmax = noop_mm;
        psVar12 = n->all->sd;
        fVar41 = psVar12->min_label;
        psVar12->min_label = -3.0;
        psVar12 = n->all->sd;
        fVar36 = psVar12->max_label;
        psVar12->max_label = 3.0;
        uVar13 = (ec_00->super_example_predict).ft_offset;
        if (n->multitask != false) {
          (ec_00->super_example_predict).ft_offset = 0;
        }
        ppVar28 = pred;
        fVar35 = extraout_XMM0_Da;
        for (uVar27 = 0; uVar27 < n->k; uVar27 = uVar27 + 1) {
          if (pbVar11[uVar27] == false) {
            fVar38 = (n->output_layer).super_example_predict.feature_space[0x81].values._begin
                     [uVar27];
            *(n->outputweight).super_example_predict.feature_space[0x81].indicies._begin =
                 (n->output_layer).super_example_predict.feature_space[0x81].indicies._begin[uVar27]
            ;
            LEARNER::learner<char,_example>::predict(base,peVar39,(ulong)n->k);
            fVar38 = fVar38 / fVar34;
            fVar37 = GD::finalize_prediction
                               (n->all->sd,
                                (n->outputweight).pred.scalar * -0.5 * fVar35 *
                                (1.0 - fVar38 * fVar38) * fVar34 + ppVar28->scalar);
            (ec_00->l).simple.label = fVar37;
            fVar38 = ppVar28->scalar;
            (ec_00->pred).scalar = fVar38;
            if ((fVar37 != fVar38) || (NAN(fVar37) || NAN(fVar38))) {
              LEARNER::learner<char,_example>::update(base,ec_00,uVar27);
            }
          }
          ppVar28 = ppVar28 + 1;
        }
        n->all->loss = plVar10;
        n->all->set_minmax = p_Var9;
        n->all->sd->min_label = fVar41;
        n->all->sd->max_label = fVar36;
        (ec_00->super_example_predict).ft_offset = uVar13;
      }
    }
    (ppVar2->simple).label = fVar5;
    if (bVar19 != 0) {
      local_36c = n->prediction;
      local_370 = (n->output_layer).partial_prediction;
      local_374 = (n->output_layer).loss;
    }
    if ((bVar19 & n->dropout) != 1) break;
    for (uVar27 = 0; uVar27 < n->k; uVar27 = uVar27 + 1) {
      pbVar11[uVar27] = (bool)(pbVar11[uVar27] ^ 1);
    }
    bVar19 = 0;
  }
  ec_00->partial_prediction = local_370;
  (ec_00->pred).scalar = local_36c;
  ec_00->loss = local_374;
  n->all->sd = psVar8;
  (*n->all->set_minmax)(n->all->sd,sd.min_label);
  (*n->all->set_minmax)(n->all->sd,sd.max_label);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&outputStringStream);
  return;
}

Assistant:

void predict_or_learn_multi(nn& n, single_learner& base, example& ec)
{
  bool shouldOutput = n.all->raw_prediction > 0;
  if (!n.finished_setup)
    finish_setup(n, *(n.all));
  shared_data sd;
  memcpy(&sd, n.all->sd, sizeof(shared_data));
  shared_data* save_sd = n.all->sd;
  n.all->sd = &sd;

  label_data ld = ec.l.simple;
  void (*save_set_minmax)(shared_data*, float) = n.all->set_minmax;
  float save_min_label;
  float save_max_label;
  float dropscale = n.dropout ? 2.0f : 1.0f;
  loss_function* save_loss = n.all->loss;

  polyprediction* hidden_units = n.hidden_units_pred;
  polyprediction* hiddenbias_pred = n.hiddenbias_pred;
  bool* dropped_out = n.dropped_out;

  ostringstream outputStringStream;

  n.all->set_minmax = noop_mm;
  n.all->loss = n.squared_loss;
  save_min_label = n.all->sd->min_label;
  n.all->sd->min_label = hidden_min_activation;
  save_max_label = n.all->sd->max_label;
  n.all->sd->max_label = hidden_max_activation;

  uint64_t save_ft_offset = ec.ft_offset;

  if (n.multitask)
    ec.ft_offset = 0;

  n.hiddenbias.ft_offset = ec.ft_offset;

  if (recompute_hidden)
  {
    base.multipredict(n.hiddenbias, 0, n.k, hiddenbias_pred, true);

    for (unsigned int i = 0; i < n.k; ++i)
      // avoid saddle point at 0
      if (hiddenbias_pred[i].scalar == 0)
      {
        n.hiddenbias.l.simple.label = (float)(merand48(n.all->random_state) - 0.5);
        base.learn(n.hiddenbias, i);
        n.hiddenbias.l.simple.label = FLT_MAX;
      }

    base.multipredict(ec, 0, n.k, hidden_units, true);

    for (unsigned int i = 0; i < n.k; ++i) dropped_out[i] = (n.dropout && merand48(n.xsubi) < 0.5);

    if (ec.passthrough)
      for (unsigned int i = 0; i < n.k; ++i)
      {
        add_passthrough_feature(ec, i * 2, hiddenbias_pred[i].scalar);
        add_passthrough_feature(ec, i * 2 + 1, hidden_units[i].scalar);
      }
  }

  if (shouldOutput)
    for (unsigned int i = 0; i < n.k; ++i)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << i << ':' << hidden_units[i].scalar << ','
                         << fasttanh(hidden_units[i].scalar);  // TODO: huh, what was going on here?
    }

  n.all->loss = save_loss;
  n.all->set_minmax = save_set_minmax;
  n.all->sd->min_label = save_min_label;
  n.all->sd->max_label = save_max_label;
  ec.ft_offset = save_ft_offset;

  bool converse = false;
  float save_partial_prediction = 0;
  float save_final_prediction = 0;
  float save_ec_loss = 0;

CONVERSE:  // That's right, I'm using goto.  So sue me.

  n.output_layer.total_sum_feat_sq = 1;
  n.output_layer.feature_space[nn_output_namespace].sum_feat_sq = 1;

  n.outputweight.ft_offset = ec.ft_offset;

  n.all->set_minmax = noop_mm;
  n.all->loss = n.squared_loss;
  save_min_label = n.all->sd->min_label;
  n.all->sd->min_label = -1;
  save_max_label = n.all->sd->max_label;
  n.all->sd->max_label = 1;

  for (unsigned int i = 0; i < n.k; ++i)
  {
    float sigmah = (dropped_out[i]) ? 0.0f : dropscale * fasttanh(hidden_units[i].scalar);
    features& out_fs = n.output_layer.feature_space[nn_output_namespace];
    out_fs.values[i] = sigmah;

    n.output_layer.total_sum_feat_sq += sigmah * sigmah;
    out_fs.sum_feat_sq += sigmah * sigmah;

    n.outputweight.feature_space[nn_output_namespace].indicies[0] = out_fs.indicies[i];
    base.predict(n.outputweight, n.k);
    float wf = n.outputweight.pred.scalar;

    // avoid saddle point at 0
    if (wf == 0)
    {
      float sqrtk = sqrt((float)n.k);
      n.outputweight.l.simple.label = (float)(merand48(n.all->random_state) - 0.5) / sqrtk;
      base.update(n.outputweight, n.k);
      n.outputweight.l.simple.label = FLT_MAX;
    }
  }

  n.all->loss = save_loss;
  n.all->set_minmax = save_set_minmax;
  n.all->sd->min_label = save_min_label;
  n.all->sd->max_label = save_max_label;

  if (n.inpass)
  {
    // TODO: this is not correct if there is something in the
    // nn_output_namespace but at least it will not leak memory
    // in that case
    ec.indices.push_back(nn_output_namespace);
    features save_nn_output_namespace = ec.feature_space[nn_output_namespace];
    ec.feature_space[nn_output_namespace] = n.output_layer.feature_space[nn_output_namespace];
    ec.total_sum_feat_sq += n.output_layer.feature_space[nn_output_namespace].sum_feat_sq;
    if (is_learn)
      base.learn(ec, n.k);
    else
      base.predict(ec, n.k);
    n.output_layer.partial_prediction = ec.partial_prediction;
    n.output_layer.loss = ec.loss;
    ec.total_sum_feat_sq -= n.output_layer.feature_space[nn_output_namespace].sum_feat_sq;
    ec.feature_space[nn_output_namespace].sum_feat_sq = 0;
    ec.feature_space[nn_output_namespace] = save_nn_output_namespace;
    ec.indices.pop();
  }
  else
  {
    n.output_layer.ft_offset = ec.ft_offset;
    n.output_layer.l = ec.l;
    n.output_layer.weight = ec.weight;
    n.output_layer.partial_prediction = 0;
    if (is_learn)
      base.learn(n.output_layer, n.k);
    else
      base.predict(n.output_layer, n.k);
    ec.l = n.output_layer.l;
  }

  n.prediction = GD::finalize_prediction(n.all->sd, n.output_layer.partial_prediction);

  if (shouldOutput)
  {
    outputStringStream << ' ' << n.output_layer.partial_prediction;
    n.all->print_text(n.all->raw_prediction, outputStringStream.str(), ec.tag);
  }

  if (is_learn && n.all->training && ld.label != FLT_MAX)
  {
    float gradient = n.all->loss->first_derivative(n.all->sd, n.prediction, ld.label);

    if (fabs(gradient) > 0)
    {
      n.all->loss = n.squared_loss;
      n.all->set_minmax = noop_mm;
      save_min_label = n.all->sd->min_label;
      n.all->sd->min_label = hidden_min_activation;
      save_max_label = n.all->sd->max_label;
      n.all->sd->max_label = hidden_max_activation;
      save_ft_offset = ec.ft_offset;

      if (n.multitask)
        ec.ft_offset = 0;

      for (unsigned int i = 0; i < n.k; ++i)
      {
        if (!dropped_out[i])
        {
          float sigmah = n.output_layer.feature_space[nn_output_namespace].values[i] / dropscale;
          float sigmahprime = dropscale * (1.0f - sigmah * sigmah);
          n.outputweight.feature_space[nn_output_namespace].indicies[0] =
              n.output_layer.feature_space[nn_output_namespace].indicies[i];
          base.predict(n.outputweight, n.k);
          float nu = n.outputweight.pred.scalar;
          float gradhw = 0.5f * nu * gradient * sigmahprime;

          ec.l.simple.label = GD::finalize_prediction(n.all->sd, hidden_units[i].scalar - gradhw);
          ec.pred.scalar = hidden_units[i].scalar;
          if (ec.l.simple.label != hidden_units[i].scalar)
            base.update(ec, i);
        }
      }

      n.all->loss = save_loss;
      n.all->set_minmax = save_set_minmax;
      n.all->sd->min_label = save_min_label;
      n.all->sd->max_label = save_max_label;
      ec.ft_offset = save_ft_offset;
    }
  }

  ec.l.simple.label = ld.label;

  if (!converse)
  {
    save_partial_prediction = n.output_layer.partial_prediction;
    save_final_prediction = n.prediction;
    save_ec_loss = n.output_layer.loss;
  }

  if (n.dropout && !converse)
  {
    for (unsigned int i = 0; i < n.k; ++i)
    {
      dropped_out[i] = !dropped_out[i];
    }

    converse = true;
    goto CONVERSE;
  }

  ec.partial_prediction = save_partial_prediction;
  ec.pred.scalar = save_final_prediction;
  ec.loss = save_ec_loss;

  n.all->sd = save_sd;
  n.all->set_minmax(n.all->sd, sd.min_label);
  n.all->set_minmax(n.all->sd, sd.max_label);
}